

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_misc.c
# Opt level: O0

size_t buffer_writer_default(void **buf_addr,size_t len,void *opt)

{
  int __fd;
  undefined8 uVar1;
  ssize_t sVar2;
  int *piVar3;
  int *in_RDX;
  size_t in_RSI;
  undefined8 *in_RDI;
  ssize_t written;
  size_t write_total;
  void *data;
  void *buf_start;
  int fd;
  profile_ctx *ctx;
  size_t local_48;
  void *local_40;
  
  __fd = *in_RDX;
  uVar1 = *in_RDI;
  local_40 = (void *)*in_RDI;
  local_48 = 0;
  while( true ) {
    while (sVar2 = write(__fd,local_40,in_RSI - local_48), sVar2 == -1) {
      piVar3 = __errno_location();
      if (*piVar3 != 4) {
        *in_RDI = 0;
        return local_48;
      }
      piVar3 = __errno_location();
      *piVar3 = 0;
    }
    local_48 = sVar2 + local_48;
    if (local_48 == in_RSI) break;
    local_40 = (void *)((long)local_40 + sVar2);
  }
  *in_RDI = uVar1;
  return local_48;
}

Assistant:

static size_t buffer_writer_default(const void **buf_addr, size_t len,
				    void *opt)
{
  struct profile_ctx *ctx = opt;
  const int fd = ctx->fd;
  const void * const buf_start = *buf_addr;
  const void *data = *buf_addr;
  size_t write_total = 0;

  lj_assertX(len <= STREAM_BUFFER_SIZE, "stream buffer overflow");

  for (;;) {
    const ssize_t written = write(fd, data, len - write_total);

    if (LJ_UNLIKELY(written == -1)) {
      /* Re-tries write in case of EINTR. */
      if (errno != EINTR) {
  /* Will be freed as whole chunk later. */
  *buf_addr = NULL;
  return write_total;
      }

      errno = 0;
      continue;
    }

    write_total += written;
    lj_assertX(write_total <= len, "invalid stream buffer write");

    if (write_total == len)
      break;

    data = (uint8_t *)data + (ptrdiff_t)written;
  }

  *buf_addr = buf_start;
  return write_total;
}